

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message ** __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::Message_const*>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  long lVar1;
  uint32 uVar2;
  Message **ppMVar3;
  
  lVar1 = *(long *)(field + 0x58);
  if ((lVar1 != 0) &&
     (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
              (ulong)(uint)((int)((ulong)(lVar1 - *(long *)(*(long *)(lVar1 + 0x10) + 0x30)) >> 4) *
                            -0x55555554 + (this->schema_).oneof_case_offset_)) !=
      *(int *)(field + 0x44))) {
    ppMVar3 = (Message **)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
    return ppMVar3;
  }
  uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}